

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error string_find_last_nonspace(char *string,size_t *index_result)

{
  bool bVar1;
  size_t sVar2;
  natwm_error nVar3;
  ushort **ppuVar4;
  size_t sVar5;
  bool bVar6;
  size_t sVar7;
  char cVar8;
  
  if (string == (char *)0x0) {
    nVar3 = INVALID_INPUT_ERROR;
  }
  else {
    cVar8 = *string;
    if (cVar8 == '\0') {
      nVar3 = NOT_FOUND_ERROR;
      sVar5 = 0;
    }
    else {
      ppuVar4 = __ctype_b_loc();
      sVar5 = 0;
      sVar7 = 0;
      bVar6 = false;
      do {
        bVar1 = true;
        if (bVar6) {
          bVar1 = bVar6;
        }
        sVar2 = sVar7;
        if ((*(byte *)((long)*ppuVar4 + (long)cVar8 * 2 + 1) & 0x20) != 0) {
          sVar2 = sVar5;
          bVar1 = bVar6;
        }
        sVar5 = sVar2;
        cVar8 = string[sVar7 + 1];
        sVar7 = sVar7 + 1;
        bVar6 = bVar1;
      } while (cVar8 != '\0');
      nVar3 = NOT_FOUND_ERROR;
      if (bVar1) {
        nVar3 = NO_ERROR;
      }
    }
    *index_result = sVar5;
  }
  return nVar3;
}

Assistant:

enum natwm_error string_find_last_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t i = 0;
        size_t index = 0;
        bool found = false;

        while ((ch = string[i]) != '\0') {
                if (!isspace(ch)) {
                        index = i;

                        if (!found) {
                                found = true;
                        }
                }

                ++i;
        }

        *index_result = index;

        if (!found) {
                return NOT_FOUND_ERROR;
        }

        return NO_ERROR;
}